

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall
spvtools::CreateEliminateDeadOutputStoresPass
          (spvtools *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *live_locs,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *live_builtins)

{
  unique_ptr<spvtools::opt::EliminateDeadOutputStoresPass,_std::default_delete<spvtools::opt::EliminateDeadOutputStoresPass>_>
  local_30;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_28;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_20;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *live_builtins_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *live_locs_local;
  
  local_20 = live_builtins;
  live_builtins_local = live_locs;
  live_locs_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)this;
  MakeUnique<spvtools::opt::EliminateDeadOutputStoresPass,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>*&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>*&>
            ((spvtools *)&local_30,&live_builtins_local,&local_20);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::EliminateDeadOutputStoresPass,std::default_delete<spvtools::opt::EliminateDeadOutputStoresPass>>>
            ((spvtools *)&local_28,&local_30);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_28);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_28);
  std::
  unique_ptr<spvtools::opt::EliminateDeadOutputStoresPass,_std::default_delete<spvtools::opt::EliminateDeadOutputStoresPass>_>
  ::~unique_ptr(&local_30);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateEliminateDeadOutputStoresPass(
    std::unordered_set<uint32_t>* live_locs,
    std::unordered_set<uint32_t>* live_builtins) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::EliminateDeadOutputStoresPass>(live_locs, live_builtins));
}